

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::BitsFunction::BitsFunction(BitsFunction *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__BitsFunction_00ddc9d0;
  return;
}

Assistant:

BitsFunction() : SystemSubroutine(KnownSystemName::Bits, SubroutineKind::Function) {}